

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O1

string * __thiscall
pbrt::LightSamplerHandle::ToString_abi_cxx11_
          (string *__return_storage_ptr__,LightSamplerHandle *this)

{
  ulong uVar1;
  short sVar2;
  char *pcVar3;
  ExhaustiveLightSampler *this_00;
  size_type __dnew;
  size_type local_18;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
          ).bits;
  this_00 = (ExhaustiveLightSampler *)(uVar1 & 0xffffffffffff);
  if (this_00 == (ExhaustiveLightSampler *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"(nullptr)","")
    ;
  }
  else {
    sVar2 = (short)(uVar1 >> 0x30);
    if (uVar1 >> 0x30 < 3) {
      if (sVar2 == 2) {
        PowerLightSampler::ToString_abi_cxx11_(__return_storage_ptr__,(PowerLightSampler *)this_00);
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        local_18 = 0x13;
        pcVar3 = (char *)std::__cxx11::string::_M_create
                                   ((ulong *)__return_storage_ptr__,(ulong)&local_18);
        (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = local_18;
        builtin_strncpy(pcVar3,"UniformLightSampler",0x13);
        __return_storage_ptr__->_M_string_length = local_18;
        (__return_storage_ptr__->_M_dataplus)._M_p[local_18] = '\0';
      }
    }
    else if (sVar2 == 3) {
      BVHLightSampler::ToString_abi_cxx11_(__return_storage_ptr__,(BVHLightSampler *)this_00);
    }
    else {
      ExhaustiveLightSampler::ToString_abi_cxx11_(__return_storage_ptr__,this_00);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LightSamplerHandle::ToString() const {
    if (!ptr())
        return "(nullptr)";

    auto ts = [&](auto ptr) { return ptr->ToString(); };
    return DispatchCPU(ts);
}